

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  Reader reader;
  string local_120;
  Reader local_100;
  
  Reader::Reader(&local_100);
  bVar1 = Reader::parse(&local_100,sin,root);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.document_._M_dataplus._M_p != &local_100.document_.field_2) {
      operator_delete(local_100.document_._M_dataplus._M_p,
                      local_100.document_.field_2._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              (&local_100.errors_);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_100);
    return sin;
  }
  Reader::getFormatedErrorMessages_abi_cxx11_(&local_120,&local_100);
  jbcoin::Throw<std::runtime_error,std::__cxx11::string>(&local_120);
}

Assistant:

std::istream& operator>> ( std::istream& sin, Value& root )
{
    Json::Reader reader;
    bool ok = reader.parse (sin, root);

    //JSON_ASSERT( ok );
    if (! ok)
        jbcoin::Throw<std::runtime_error> (reader.getFormatedErrorMessages ());

    return sin;
}